

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall
QtPrivate::QCalendarDelegate::paintCell
          (QCalendarDelegate *this,QPainter *painter,QRect *rect,QDate date)

{
  long *plVar1;
  undefined8 uVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  QStyleOptionViewItem *in_RDX;
  QPainter *in_RSI;
  QStyledItemDelegate *in_RDI;
  long in_FS_OFFSET;
  QModelIndex idx;
  int col;
  int row;
  QCalendarModel *in_stack_ffffffffffffff90;
  QModelIndex *index;
  QStyledItemDelegate *this_00;
  undefined1 local_50 [8];
  QDate in_stack_ffffffffffffffb8;
  undefined1 *local_38;
  undefined1 *puStack_30;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_28;
  undefined4 local_18;
  undefined4 local_14;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = (in_RDX->super_QStyleOption).type;
  uVar2 = *(undefined8 *)&(in_RDX->super_QStyleOption).state;
  *(int *)&in_RDI[2].super_QAbstractItemDelegate.field_0x8 = (in_RDX->super_QStyleOption).version;
  *(int *)&in_RDI[2].super_QAbstractItemDelegate.field_0xc = iVar3;
  *(undefined8 *)&in_RDI[3].super_QAbstractItemDelegate = uVar2;
  local_14 = 0xffffffff;
  local_18 = 0xffffffff;
  this_00 = in_RDI;
  QCalendarModel::cellForDate
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffffb8,
             (int *)&in_RDI[1].super_QAbstractItemDelegate.field_0x8,(int *)in_RDI);
  uVar5 = local_14;
  uVar4 = local_18;
  local_28.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  plVar1 = *(long **)(*(long *)&in_RDI[1].super_QAbstractItemDelegate + 600);
  QModelIndex::QModelIndex((QModelIndex *)0x51b311);
  index = (QModelIndex *)&local_38;
  (**(code **)(*plVar1 + 0x60))(index,plVar1,uVar5,uVar4,local_50);
  QStyledItemDelegate::paint(this_00,in_RSI,in_RDX,index);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarDelegate::paintCell(QPainter *painter, const QRect &rect, QDate date) const
{
    storedOption.rect = rect;
    int row = -1;
    int col = -1;
    calendarWidgetPrivate->m_model->cellForDate(date, &row, &col);
    QModelIndex idx = calendarWidgetPrivate->m_model->index(row, col);
    QStyledItemDelegate::paint(painter, storedOption, idx);
}